

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O2

void __thiscall antlr::CharScanner::reportError(CharScanner *this,string *s)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  ostream *poVar4;
  
  iVar2 = (*(this->super_TokenStream)._vptr_TokenStream[0x1a])();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var,iVar2),"");
  if (bVar1) {
    poVar4 = (ostream *)&std::cerr;
    pcVar3 = "error: ";
  }
  else {
    iVar2 = (*(this->super_TokenStream)._vptr_TokenStream[0x1a])(this);
    poVar4 = std::operator<<((ostream *)&std::cerr,*(char **)CONCAT44(extraout_var_00,iVar2));
    pcVar3 = ": error: ";
  }
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,(s->_M_dataplus)._M_p);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void CharScanner::reportError(const ANTLR_USE_NAMESPACE(std)string& s)
{
	if (getFilename() == "")
		ANTLR_USE_NAMESPACE(std)cerr << "error: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
	else
		ANTLR_USE_NAMESPACE(std)cerr << getFilename().c_str() << ": error: " << s.c_str() << ANTLR_USE_NAMESPACE(std)endl;
}